

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O2

int write_sparse_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  uint32_t fill_val_local;
  chunk_header_t chunk_header;
  
  uVar1 = out->block_size;
  uVar4 = (len + uVar1) - 1;
  chunk_header.chunk_sz = uVar4 / uVar1;
  chunk_header.chunk_type = 0xcac2;
  chunk_header.reserved1 = 0;
  chunk_header.total_sz = 0x10;
  fill_val_local = fill_val;
  iVar2 = (*out->ops->write)(out,&chunk_header,0xc);
  iVar6 = -1;
  if (-1 < iVar2) {
    iVar2 = (*out->ops->write)(out,&fill_val_local,4);
    if (-1 < iVar2) {
      if (out->use_crc != 0) {
        uVar5 = out->block_size >> 2;
        while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
          uVar3 = sparse_crc32(out->crc32,&fill_val_local,4);
          out->crc32 = uVar3;
        }
      }
      out->cur_out_ptr = out->cur_out_ptr + (long)(int)(uVar4 - uVar4 % uVar1);
      out->chunk_cnt = out->chunk_cnt + 1;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int write_sparse_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  chunk_header_t chunk_header;
  int rnd_up_len, count;
  int ret;

  /* Round up the fill length to a multiple of the block size */
  rnd_up_len = ALIGN(len, out->block_size);

  /* Finally we can safely emit a chunk of data */
  chunk_header.chunk_type = CHUNK_TYPE_FILL;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = rnd_up_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN + sizeof(fill_val);
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));

  if (ret < 0) return -1;
  ret = out->ops->write(out, &fill_val, sizeof(fill_val));
  if (ret < 0) return -1;

  if (out->use_crc) {
    count = out->block_size / sizeof(uint32_t);
    while (count--) out->crc32 = sparse_crc32(out->crc32, &fill_val, sizeof(uint32_t));
  }

  out->cur_out_ptr += rnd_up_len;
  out->chunk_cnt++;

  return 0;
}